

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

int ap_to_rw_prot(CPUARMState_conflict *env,ARMMMUIdx mmu_idx,int ap,int domain_prot)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = mmu_idx - ARMMMUIdx_E10_0;
  if (((uVar1 < 0x37) &&
      (env = (CPUARMState_conflict *)0x55000000010082,
      (0x55000000010082U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (env = (CPUARMState_conflict *)0xd, (0xdUL >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0x2386,(char *)0x0);
  }
  if (domain_prot != 3) {
    iVar2 = (*(code *)(&DAT_00d7d3b8 + *(int *)(&DAT_00d7d3b8 + (ulong)(uint)ap * 4)))(env);
    return iVar2;
  }
  return 3;
}

Assistant:

static inline int ap_to_rw_prot(CPUARMState *env, ARMMMUIdx mmu_idx,
                                int ap, int domain_prot)
{
    bool is_user = regime_is_user(env, mmu_idx);

    if (domain_prot == 3) {
        return PAGE_READ | PAGE_WRITE;
    }

    switch (ap) {
    case 0:
        if (arm_feature(env, ARM_FEATURE_V7)) {
            return 0;
        }
        switch (regime_sctlr(env, mmu_idx) & (SCTLR_S | SCTLR_R)) {
        case SCTLR_S:
            return is_user ? 0 : PAGE_READ;
        case SCTLR_R:
            return PAGE_READ;
        default:
            return 0;
        }
    case 1:
        return is_user ? 0 : PAGE_READ | PAGE_WRITE;
    case 2:
        if (is_user) {
            return PAGE_READ;
        } else {
            return PAGE_READ | PAGE_WRITE;
        }
    case 3:
        return PAGE_READ | PAGE_WRITE;
    case 4: /* Reserved.  */
        return 0;
    case 5:
        return is_user ? 0 : PAGE_READ;
    case 6:
        return PAGE_READ;
    case 7:
        if (!arm_feature(env, ARM_FEATURE_V6K)) {
            return 0;
        }
        return PAGE_READ;
    default:
        g_assert_not_reached();
        // never reach here
        return PAGE_READ;
    }
}